

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

FindInfo __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::find_first_non_full
          (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
           *this,size_t hashval)

{
  ctrl_t *pcVar1;
  FindInfo FVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  BitMask<unsigned_int,_16,_0> local_5c;
  undefined1 local_58 [4];
  BitMask<unsigned_int,_16,_0> mask;
  Group g;
  undefined1 local_40 [8];
  probe_seq<16UL> seq;
  size_t hashval_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
  *this_local;
  
  seq.index_ = hashval;
  probe((probe_seq<16UL> *)local_40,this,hashval);
  while( true ) {
    pcVar1 = this->ctrl_;
    sVar5 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_58,pcVar1 + sVar5);
    local_5c = GroupSse2Impl::MatchEmptyOrDeleted((GroupSse2Impl *)local_58);
    bVar3 = BitMask::operator_cast_to_bool((BitMask *)&local_5c);
    if (bVar3) {
      uVar4 = BitMask<unsigned_int,_16,_0>::LowestBitSet(&local_5c);
      sVar5 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(ulong)uVar4);
      sVar6 = probe_seq<16UL>::getindex((probe_seq<16UL> *)local_40);
      FVar2.probe_length = sVar6;
      FVar2.offset = sVar5;
      return FVar2;
    }
    sVar5 = probe_seq<16UL>::getindex((probe_seq<16UL> *)local_40);
    if (this->capacity_ <= sVar5) break;
    probe_seq<16UL>::next((probe_seq<16UL> *)local_40);
  }
  __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x89c,
                "FindInfo phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::priv::(anonymous namespace)::BadFastHash, std::equal_to<int>, std::allocator<int>>::find_first_non_full(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::priv::(anonymous namespace)::BadFastHash, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hashval) {
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset((size_t)mask.LowestBitSet()), seq.getindex()};
            }
            assert(seq.getindex() < capacity_ && "full table!");
            seq.next();
        }
    }